

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

CURLcode mqtt_subscribe(Curl_easy *data)

{
  connectdata *pcVar1;
  int iVar2;
  size_t __n;
  connectdata *conn;
  size_t n;
  uchar *puStack_38;
  char encodedsize [4];
  size_t packetlen;
  uchar *packet;
  size_t topiclen;
  char *topic;
  Curl_easy *pCStack_10;
  CURLcode result;
  Curl_easy *data_local;
  
  topic._4_4_ = 0;
  topiclen = 0;
  packetlen = 0;
  pcVar1 = data->conn;
  pCStack_10 = data;
  topic._4_4_ = mqtt_get_topic(data,(char **)&topiclen,(size_t *)&packet);
  if (topic._4_4_ == CURLE_OK) {
    (pcVar1->proto).mqtt.packetid = (pcVar1->proto).mqtt.packetid + 1;
    puStack_38 = packet + 5;
    iVar2 = mqtt_encode_len((char *)((long)&n + 4),(size_t)puStack_38);
    __n = (size_t)iVar2;
    puStack_38 = puStack_38 + __n + 1;
    packetlen = (size_t)(*Curl_cmalloc)((size_t)puStack_38);
    if ((char *)packetlen == (char *)0x0) {
      topic._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      *(char *)packetlen = -0x7e;
      memcpy((char *)(packetlen + 1),(void *)((long)&n + 4),__n);
      *(char *)(packetlen + __n + 1) = (char)((pcVar1->proto).mqtt.packetid >> 8);
      *(char *)(packetlen + __n + 2) = (char)(pcVar1->proto).mqtt.packetid;
      *(char *)(packetlen + __n + 3) = (char)((ulong)packet >> 8);
      *(char *)(packetlen + __n + 4) = (char)packet;
      memcpy((char *)(packetlen + __n + 5),(void *)topiclen,(size_t)packet);
      *(char *)(packetlen + (long)(packet + __n + 5)) = '\0';
      topic._4_4_ = mqtt_send(pCStack_10,(char *)packetlen,(size_t)puStack_38);
    }
  }
  (*Curl_cfree)((void *)topiclen);
  (*Curl_cfree)((void *)packetlen);
  return topic._4_4_;
}

Assistant:

static CURLcode mqtt_subscribe(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  char *topic = NULL;
  size_t topiclen;
  unsigned char *packet = NULL;
  size_t packetlen;
  char encodedsize[4];
  size_t n;
  struct connectdata *conn = data->conn;

  result = mqtt_get_topic(data, &topic, &topiclen);
  if(result)
    goto fail;

  conn->proto.mqtt.packetid++;

  packetlen = topiclen + 5; /* packetid + topic (has a two byte length field)
                               + 2 bytes topic length + QoS byte */
  n = mqtt_encode_len((char *)encodedsize, packetlen);
  packetlen += n + 1; /* add one for the control packet type byte */

  packet = malloc(packetlen);
  if(!packet) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  packet[0] = MQTT_MSG_SUBSCRIBE;
  memcpy(&packet[1], encodedsize, n);
  packet[1 + n] = (conn->proto.mqtt.packetid >> 8) & 0xff;
  packet[2 + n] = conn->proto.mqtt.packetid & 0xff;
  packet[3 + n] = (topiclen >> 8) & 0xff;
  packet[4 + n ] = topiclen & 0xff;
  memcpy(&packet[5 + n], topic, topiclen);
  packet[5 + n + topiclen] = 0; /* QoS zero */

  result = mqtt_send(data, (char *)packet, packetlen);

fail:
  free(topic);
  free(packet);
  return result;
}